

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O2

void __thiscall Fl_Browser_::display(Fl_Browser_ *this,void *item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  undefined4 extraout_var_02;
  int iVar7;
  int H;
  int W;
  int local_38;
  int X;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  update_top(this);
  iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
  if ((void *)CONCAT44(extraout_var,iVar1) == item) {
    iVar1 = 0;
  }
  else {
    bbox(this,&X,&local_38,&W,&H);
    pvVar6 = this->top_;
    iVar7 = this->offset_;
    if (pvVar6 == item) {
      iVar1 = this->real_position_;
    }
    else {
      iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar6);
      pvVar4 = (void *)CONCAT44(extraout_var_00,iVar1);
      if (pvVar4 != item) {
        iVar7 = -iVar7;
        iVar3 = iVar7;
        do {
          pvVar5 = pvVar4;
          if (pvVar6 == (void *)0x0 && pvVar5 == (void *)0x0) {
            return;
          }
          if (pvVar6 == (void *)0x0) {
            pvVar6 = (void *)0x0;
          }
          else {
            iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,pvVar6);
            if (pvVar6 == item) {
              if (H < iVar7) {
                iVar1 = (H - iVar1) / -2 + iVar7 + this->real_position_;
              }
              else {
                iVar1 = (iVar7 + iVar1) - H;
                if (iVar1 < 1) {
                  return;
                }
                iVar1 = iVar1 + this->real_position_;
              }
              goto LAB_001b5f2d;
            }
            iVar7 = iVar7 + iVar1;
            iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar6);
            pvVar6 = (void *)CONCAT44(extraout_var_01,iVar1);
          }
          pvVar4 = (void *)0x0;
          if (pvVar5 != (void *)0x0) {
            iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,pvVar5);
            if (pvVar5 == item) {
              iVar1 = (iVar3 - iVar2) + this->real_position_;
              if (iVar3 < 0) {
                iVar1 = iVar1 + (H - iVar2) / -2;
              }
              goto LAB_001b5f2d;
            }
            iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar5);
            pvVar4 = (void *)CONCAT44(extraout_var_02,iVar1);
            iVar3 = iVar3 - iVar2;
          }
        } while( true );
      }
      iVar1 = this->real_position_;
      iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,pvVar4);
      iVar7 = iVar7 + iVar3;
    }
    iVar1 = iVar1 - iVar7;
  }
LAB_001b5f2d:
  position(this,iVar1);
  return;
}

Assistant:

void Fl_Browser_::display(void* item) {

  // First special case - want to display first item in the list?
  update_top();
  if (item == item_first()) {position(0); return;}

  int X, Y, W, H, Yp; bbox(X, Y, W, H);
  void* l = top_;
  Y = Yp = -offset_;
  int h1;

  // 2nd special case - want to display item already displayed at top of browser?
  if (l == item) {position(real_position_+Y); return;} // scroll up a bit

  // 3rd special case - want to display item just above top of browser?
  void* lp = item_prev(l);
  if (lp == item) {position(real_position_+Y-item_quick_height(lp)); return;}

#ifdef DISPLAY_SEARCH_BOTH_WAYS_AT_ONCE
  // search for item.  We search both up and down the list at the same time,
  // this evens up the execution time for the two cases - the old way was
  // much slower for going up than for going down.
  while (l || lp) {
    if (l) {
      h1 = item_quick_height(l);
      if (l == item) {
	if (Y <= H) { // it is visible or right at bottom
	  Y = Y+h1-H; // find where bottom edge is
	  if (Y > 0) position(real_position_+Y); // scroll down a bit
	} else {
	  position(real_position_+Y-(H-h1)/2); // center it
	}
	return;
      }
      Y += h1;
      l = item_next(l);
    }
    if (lp) {
      h1 = item_quick_height(lp);
      Yp -= h1;
      if (lp == item) {
	if ((Yp + h1) >= 0) position(real_position_+Yp);
	else position(real_position_+Yp-(H-h1)/2);
	return;
      }
      lp = item_prev(lp);
    }
  }
#else
  // Old version went forwards and then backwards:
  // search forward for it:
  l = top_;
  for (; l; l = item_next(l)) {
    h1 = item_quick_height(l);
    if (l == item) {
      if (Y <= H) { // it is visible or right at bottom
	Y = Y+h1-H; // find where bottom edge is
	if (Y > 0) position(real_position_+Y); // scroll down a bit
      } else {
	position(real_position_+Y-(H-h1)/2); // center it
      }
      return;
    }
    Y += h1;
  }
  // search backward for it, if found center it:
  l = lp;
  Y = -offset_;
  for (; l; l = item_prev(l)) {
    h1 = item_quick_height(l);
    Y -= h1;
    if (l == item) {
      if ((Y + h1) >= 0) position(real_position_+Y);
      else position(real_position_+Y-(H-h1)/2);
      return;
    }
  }
#endif
}